

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_helper_unpolar<ExchCXX::BuiltinPC07OPT_K>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  long lVar1;
  double sigma_00;
  double tau_00;
  
  if (0 < N) {
    lVar1 = 0;
    do {
      if (*(double *)((long)rho + lVar1) <= 1e-15) {
        *(double *)((long)eps + lVar1) = 0.0;
      }
      else {
        sigma_00 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= *(double *)((long)sigma + lVar1)) {
          sigma_00 = *(double *)((long)sigma + lVar1);
        }
        tau_00 = 0.0;
        if (0.0 <= *(double *)((long)tau + lVar1)) {
          tau_00 = *(double *)((long)tau + lVar1);
        }
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_unpolar_impl
                  (*(double *)((long)rho + lVar1),sigma_00,*(double *)((long)lapl + lVar1),tau_00,
                   (double *)((long)eps + lVar1));
      }
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], eps[i] );

  }

}